

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btActivatingCollisionAlgorithm.cpp
# Opt level: O2

void __thiscall
btActivatingCollisionAlgorithm::btActivatingCollisionAlgorithm
          (btActivatingCollisionAlgorithm *this,btCollisionAlgorithmConstructionInfo *ci,
          btCollisionObjectWrapper *param_2,btCollisionObjectWrapper *param_3)

{
  btCollisionAlgorithm::btCollisionAlgorithm(&this->super_btCollisionAlgorithm,ci);
  (this->super_btCollisionAlgorithm)._vptr_btCollisionAlgorithm =
       (_func_int **)&PTR__btActivatingCollisionAlgorithm_001ec760;
  return;
}

Assistant:

btActivatingCollisionAlgorithm::btActivatingCollisionAlgorithm (const btCollisionAlgorithmConstructionInfo& ci, const btCollisionObjectWrapper* ,const btCollisionObjectWrapper* )
:btCollisionAlgorithm(ci)
//,
//m_colObj0(0),
//m_colObj1(0)
{
//	if (ci.m_dispatcher1->needsCollision(colObj0,colObj1))
//	{
//		m_colObj0 = colObj0;
//		m_colObj1 = colObj1;
//		
//		m_colObj0->activate();
//		m_colObj1->activate();
//	}
}